

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  XML *this_00;
  string *parmID;
  int iVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  mapped_type *pmVar6;
  Node *pNVar7;
  undefined8 *puVar8;
  runtime_error *prVar9;
  long *plVar10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _func_int **pp_Var13;
  CurveSubtype subtype;
  size_t *in_RDX;
  char *pcVar14;
  Ref<embree::XML> *xml_00;
  undefined8 uVar15;
  string str_type;
  Vec2f time_range;
  string id;
  Ref<embree::SceneGraph::MaterialNode> material;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [2];
  _Alloc_hider local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [16];
  
  iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
  if (iVar2 == 0) {
    pXVar1 = (XML *)*in_RDX;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_e8 + 0x10);
    local_e8._0_8_ = paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"type","");
    XML::parm((string *)&local_148.field_1,pXVar1,(string *)local_e8);
    iVar2 = std::__cxx11::string::compare((char *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._0_8_ != &local_138) {
      operator_delete((void *)local_148._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != paVar5) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (iVar2 == 0) {
      pXVar1 = (XML *)*in_RDX;
      local_e8._0_8_ = paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"id","");
      XML::parm((string *)&local_148.field_1,pXVar1,(string *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != paVar5) {
        operator_delete((void *)local_e8._0_8_);
      }
      XML::child((XML *)local_e8,*in_RDX);
      loadMaterial((XMLLoader *)(local_e8 + 0x20),xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_e8._0_8_ + 0x18))();
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)xml[10].ptr,(key_type *)&local_148.field_1);
      uVar15 = local_c8._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*local_c8._M_allocated_capacity + 0x10))(local_c8._M_allocated_capacity);
      }
      if (pmVar4->ptr != (MaterialNode *)0x0) {
        (*(pmVar4->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar4->ptr = (MaterialNode *)uVar15;
      pXVar1 = (XML *)*in_RDX;
      local_108._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_108 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"name","");
      XML::parm((string *)local_e8,pXVar1,(string *)local_108);
      std::__cxx11::string::operator=
                ((string *)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(uVar15 + 0x30))->_M_local_buf,(string *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != paVar5) {
        operator_delete((void *)local_e8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_);
      }
      (this->path).filename._M_dataplus._M_p = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)uVar15 + 0x18))(uVar15);
      }
    }
    else {
      pXVar1 = (XML *)*in_RDX;
      local_e8._0_8_ = paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"type","");
      XML::parm((string *)&local_148.field_1,pXVar1,(string *)local_e8);
      iVar2 = std::__cxx11::string::compare((char *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ != &local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != paVar5) {
        operator_delete((void *)local_e8._0_8_);
      }
      if (iVar2 != 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_((string *)local_108,(ParseLocation *)(*in_RDX + 0x10));
        puVar8 = (undefined8 *)std::__cxx11::string::append(local_108);
        local_e8._0_8_ = *puVar8;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._0_8_ == paVar12) {
          local_e8._16_8_ = paVar12->_M_allocated_capacity;
          local_e8._24_4_ = *(undefined4 *)(puVar8 + 3);
          local_e8._28_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
          local_e8._0_8_ = paVar5;
        }
        else {
          local_e8._16_8_ = paVar12->_M_allocated_capacity;
        }
        local_e8._8_8_ = puVar8[1];
        *puVar8 = paVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        pXVar1 = (XML *)*in_RDX;
        local_a8._M_allocated_capacity = (size_type)&local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"type","");
        XML::parm((string *)(local_e8 + 0x20),pXVar1,(string *)&local_a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_148.field_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_e8 + 0x20));
        std::runtime_error::runtime_error(prVar9,(string *)&local_148.field_1);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pXVar1 = (XML *)*in_RDX;
      local_e8._0_8_ = paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"id","");
      XML::parm((string *)&local_148.field_1,pXVar1,(string *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != paVar5) {
        operator_delete((void *)local_e8._0_8_);
      }
      XML::child((XML *)local_108,*in_RDX);
      loadNode((XMLLoader *)local_e8,xml);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,(key_type *)&local_148.field_1);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar3->ptr = (Node *)local_e8._0_8_;
      local_e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_108._0_8_ + 0x18))();
      }
      (this->path).filename._M_dataplus._M_p = (pointer)0x0;
    }
    paVar5 = &local_138;
    uVar15 = local_148._0_8_;
    goto LAB_001c2669;
  }
  (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  pXVar1 = (XML *)*in_RDX;
  local_148._0_8_ = &local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"id","");
  XML::parm((string *)local_e8,pXVar1,(string *)&local_148.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._0_8_ != &local_138) {
    operator_delete((void *)local_148._0_8_);
  }
  iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
  if (iVar2 == 0) {
    pXVar1 = (XML *)*in_RDX;
    local_c8._M_allocated_capacity = (size_type)local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x20),"src","");
    XML::parm((string *)local_108,pXVar1,(string *)(local_e8 + 0x20));
    FileName::operator+((FileName *)&local_148.field_1,(FileName *)xml,(string *)local_108);
    SceneGraph::load((SceneGraph *)local_a8._M_local_buf,(FileName *)&local_148.field_1,false);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent,(key_type *)local_e8);
    if (pmVar3->ptr != (Node *)0x0) {
      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar3->ptr = (Node *)local_a8._0_8_;
    local_a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    if (pmVar3->ptr != (Node *)0x0) {
      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
    }
    (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*local_a8._M_allocated_capacity + 0x18))();
    }
LAB_001c25b8:
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._0_8_ != &local_138) {
      operator_delete((void *)local_148._0_8_);
    }
    uVar15 = local_c8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
      uVar15 = local_c8._M_allocated_capacity;
    }
LAB_001c25e7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar15 != paVar5) {
LAB_001c25ec:
      operator_delete((void *)uVar15);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
    if (iVar2 == 0) {
      pXVar1 = (XML *)*in_RDX;
      paVar5 = &local_98;
      local_a8._M_allocated_capacity = (size_type)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"src","");
      XML::parm((string *)(local_e8 + 0x20),pXVar1,(string *)&local_a8);
      FileName::operator+((FileName *)local_108,(FileName *)xml,(string *)(local_e8 + 0x20));
      local_148._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x3f800000;
      local_148._8_8_ = 0;
      local_138._M_allocated_capacity = 0x3f80000000000000;
      local_138._8_8_ = 0;
      local_128 = 0;
      uStack_120 = 0x3f800000;
      local_118 = 0;
      uStack_110 = 0;
      load((XMLLoader *)local_88,(FileName *)local_108,(AffineSpace3fa *)&local_148.field_1,
           (SharedState *)xml[10].ptr);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,(key_type *)local_e8);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      uVar15 = local_88[0]._0_8_;
      pmVar3->ptr = (Node *)local_88[0]._0_8_;
      local_88[0]._0_8_ = (Node *)0x0;
      if ((Node *)uVar15 != (Node *)0x0) {
        (**(code **)(*(long *)uVar15 + 0x10))();
      }
      (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_);
      }
      uVar15 = local_a8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8) {
        operator_delete((void *)local_c8._M_allocated_capacity);
        uVar15 = local_a8._0_8_;
      }
      goto LAB_001c25e7;
    }
    iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
    if (iVar2 == 0) {
      pXVar1 = (XML *)*in_RDX;
      local_c8._M_allocated_capacity = (size_type)local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x20),"src","");
      XML::parm((string *)local_108,pXVar1,(string *)(local_e8 + 0x20));
      FileName::operator+((FileName *)&local_148.field_1,(FileName *)xml,(string *)local_108);
      SceneGraph::load((SceneGraph *)local_a8._M_local_buf,(FileName *)&local_148.field_1,true);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,(key_type *)local_e8);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar3->ptr = (Node *)local_a8._0_8_;
      local_a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
      }
      (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*local_a8._M_allocated_capacity + 0x18))();
      }
      goto LAB_001c25b8;
    }
    iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
    if (iVar2 == 0) {
      pXVar1 = (XML *)*in_RDX;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_108 + 0x10);
      local_108._0_8_ = paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"subdiv","");
      XML::parm((string *)&local_148.field_1,pXVar1,(string *)local_108);
      iVar2 = std::__cxx11::string::compare((char *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ != &local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ != paVar5) {
        operator_delete((void *)local_108._0_8_);
      }
      pXVar1 = (XML *)*in_RDX;
      local_c8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x20),"src","");
      XML::parm((string *)local_108,pXVar1,(string *)(local_e8 + 0x20));
      FileName::operator+((FileName *)&local_148.field_1,(FileName *)xml,(string *)local_108);
      loadOBJ((embree *)local_a8._M_local_buf,(FileName *)&local_148.field_1,iVar2 == 0,false);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,(key_type *)local_e8);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar3->ptr = (Node *)local_a8._0_8_;
      local_a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
      }
      (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*local_a8._M_allocated_capacity + 0x18))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ != &local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ != paVar5) {
        operator_delete((void *)local_108._0_8_);
      }
      uVar15 = local_c8._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_allocated_capacity ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8) goto LAB_001c25f1;
      goto LAB_001c25ec;
    }
    iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
    if (iVar2 == 0) {
      pXVar1 = xml[10].ptr;
      this_00 = (XML *)*in_RDX;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_108 + 0x10);
      local_108._0_8_ = paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"id","");
      XML::parm((string *)&local_148.field_1,this_00,(string *)local_108);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&(pXVar1->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,(key_type *)&local_148.field_1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,(key_type *)local_e8);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar6->ptr != (Node *)0x0) {
        (*(pmVar6->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pNVar7 = pmVar3->ptr;
      pmVar6->ptr = pNVar7;
      if (pNVar7 != (Node *)0x0) {
        (*(pNVar7->super_RefCount)._vptr_RefCount[2])();
      }
      (this->path).filename._M_dataplus._M_p = (pointer)pmVar6->ptr;
      uVar15 = local_108._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._0_8_ != &local_138) {
        operator_delete((void *)local_148._0_8_);
        uVar15 = local_108._0_8_;
      }
      goto LAB_001c25e7;
    }
    pcVar14 = "PointLight";
    iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
    if (iVar2 == 0) {
      loadPointLight((XMLLoader *)&local_148.field_1,(Ref<embree::XML> *)pcVar14);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,(key_type *)local_e8);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      uVar15 = local_148._0_8_;
      pmVar3->ptr = (Node *)local_148._0_8_;
      local_148._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)uVar15 + 0x10))();
      }
LAB_001c2cb9:
      pNVar7 = pmVar3->ptr;
LAB_001c2cbc:
      (this->path).filename._M_dataplus._M_p = (pointer)pNVar7;
    }
    else {
      pcVar14 = "SpotLight";
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadSpotLight((XMLLoader *)&local_148.field_1,(Ref<embree::XML> *)pcVar14);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      pcVar14 = "DirectionalLight";
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadDirectionalLight((XMLLoader *)&local_148.field_1,(Ref<embree::XML> *)pcVar14);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      pcVar14 = "DistantLight";
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadDistantLight((XMLLoader *)&local_148.field_1,(Ref<embree::XML> *)pcVar14);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      pcVar14 = "AmbientLight";
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadAmbientLight((XMLLoader *)&local_148.field_1,(Ref<embree::XML> *)pcVar14);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      pcVar14 = "TriangleLight";
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadTriangleLight((XMLLoader *)&local_148.field_1,(Ref<embree::XML> *)pcVar14);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadAnimatedLight((XMLLoader *)&local_148.field_1,xml);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      pcVar14 = "QuadLight";
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadQuadLight((XMLLoader *)&local_148.field_1,(Ref<embree::XML> *)pcVar14);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadTriangleMesh((XMLLoader *)&local_148.field_1,xml);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadQuadMesh((XMLLoader *)&local_148.field_1,xml);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadGridMesh((XMLLoader *)&local_148.field_1,xml);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadSubdivMesh((XMLLoader *)&local_148.field_1,xml);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2cb9;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      subtype = (CurveSubtype)in_RDX;
      if (iVar2 == 0) {
        loadBezierCurves((XMLLoader *)&local_148.field_1,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
LAB_001c2f9a:
        pNVar7 = pmVar3->ptr;
        goto LAB_001c2cbc;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadCurves((XMLLoader *)&local_148.field_1,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2f9a;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadCurves((XMLLoader *)&local_148.field_1,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2f9a;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadCurves((XMLLoader *)&local_148.field_1,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2f9a;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadBezierCurves((XMLLoader *)&local_148.field_1,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2f9a;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadCurves((XMLLoader *)&local_148.field_1,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2f9a;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadBezierCurves((XMLLoader *)&local_148.field_1,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2f9a;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadCurves((XMLLoader *)&local_148.field_1,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_148._0_8_;
        pmVar3->ptr = (Node *)local_148._0_8_;
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)uVar15 + 0x10))();
        }
        goto LAB_001c2f9a;
      }
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        pXVar1 = (XML *)*in_RDX;
        local_108._0_8_ = (Node *)(local_108 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"type","");
        XML::parm((string *)&local_148.field_1,pXVar1,(string *)local_108);
        if ((Node *)local_108._0_8_ != (Node *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_);
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_148);
        if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)&local_148), iVar2 != 0)
            ) && (iVar2 = std::__cxx11::string::compare((char *)&local_148), iVar2 != 0)) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_((string *)&local_a8,(ParseLocation *)(*in_RDX + 0x10));
          plVar10 = (long *)std::__cxx11::string::append(local_a8._M_local_buf);
          local_c8._M_allocated_capacity = *plVar10;
          psVar11 = (size_type *)(plVar10 + 2);
          if ((size_type *)local_c8._M_allocated_capacity == psVar11) {
            local_b8._0_8_ = *psVar11;
            local_b8._8_8_ = plVar10[3];
            local_c8._M_allocated_capacity = (size_type)local_b8;
          }
          else {
            local_b8._0_8_ = *psVar11;
          }
          local_c8._8_8_ = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_e8 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_148.field_1);
          std::runtime_error::runtime_error(prVar9,(string *)local_108);
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        loadPoints((XMLLoader *)local_108,xml,subtype);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)local_e8);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar15 = local_108._0_8_;
        pmVar3->ptr = (Node *)local_108._0_8_;
        local_108._0_8_ = (_func_int **)0x0;
        if ((Node *)uVar15 != (Node *)0x0) {
          (**(code **)(*(long *)uVar15 + 0x10))();
        }
        (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
LAB_001c37b6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._0_8_ != &local_138) {
          operator_delete((void *)local_148._0_8_);
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          pXVar1 = (XML *)*in_RDX;
          pp_Var13 = (_func_int **)(local_108 + 0x10);
          local_108._0_8_ = pp_Var13;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"basis","");
          XML::parm((string *)&local_148.field_1,pXVar1,(string *)local_108);
          if ((_func_int **)local_108._0_8_ != pp_Var13) {
            operator_delete((void *)local_108._0_8_);
          }
          pXVar1 = (XML *)*in_RDX;
          local_c8._M_allocated_capacity = (size_type)(Node *)local_b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x20),"type","");
          XML::parm((string *)local_108,pXVar1,(string *)(local_e8 + 0x20));
          if ((Node *)local_c8._M_allocated_capacity != (Node *)local_b8) {
            operator_delete((void *)local_c8._M_allocated_capacity);
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_148);
          if (iVar2 == 0) {
            iVar2 = std::__cxx11::string::compare(local_108);
            if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              ParseLocation::str_abi_cxx11_((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
              plVar10 = (long *)std::__cxx11::string::append(local_88[0]._M_local_buf);
              local_a8._M_allocated_capacity = *plVar10;
              paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_allocated_capacity == paVar5) {
                local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_98._8_8_ = plVar10[3];
                local_a8._M_allocated_capacity = (size_type)&local_98;
              }
              else {
                local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
              }
              local_a8._8_8_ = plVar10[1];
              *plVar10 = (long)paVar5;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_e8 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108);
              std::runtime_error::runtime_error(prVar9,(string *)(local_e8 + 0x20));
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_148);
            if (iVar2 == 0) {
              iVar2 = std::__cxx11::string::compare(local_108);
              if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0))
                 && ((iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0 &&
                     ((iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0 &&
                      (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)))))) {
                prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                ParseLocation::str_abi_cxx11_((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                plVar10 = (long *)std::__cxx11::string::append(local_88[0]._M_local_buf);
                local_a8._M_allocated_capacity = *plVar10;
                paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_allocated_capacity == paVar5) {
                  local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  local_98._8_8_ = plVar10[3];
                  local_a8._M_allocated_capacity = (size_type)&local_98;
                }
                else {
                  local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                }
                local_a8._8_8_ = plVar10[1];
                *plVar10 = (long)paVar5;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_e8 + 0x20),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108);
                std::runtime_error::runtime_error(prVar9,(string *)(local_e8 + 0x20));
                __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_148);
              if (iVar2 == 0) {
                iVar2 = std::__cxx11::string::compare(local_108);
                if ((((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)
                     ) && (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)) &&
                   ((iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0 &&
                    (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)))) {
                  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ParseLocation::str_abi_cxx11_
                            ((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                  plVar10 = (long *)std::__cxx11::string::append(local_88[0]._M_local_buf);
                  local_a8._M_allocated_capacity = *plVar10;
                  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_allocated_capacity == paVar5) {
                    local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                    local_98._8_8_ = plVar10[3];
                    local_a8._M_allocated_capacity = (size_type)&local_98;
                  }
                  else {
                    local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                  }
                  local_a8._8_8_ = plVar10[1];
                  *plVar10 = (long)paVar5;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_e8 + 0x20),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_a8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108);
                  std::runtime_error::runtime_error(prVar9,(string *)(local_e8 + 0x20));
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_148);
                if (iVar2 == 0) {
                  iVar2 = std::__cxx11::string::compare(local_108);
                  if (((iVar2 != 0) &&
                      (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)) &&
                     ((iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0 &&
                      ((iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0 &&
                       (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)))))) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ParseLocation::str_abi_cxx11_
                              ((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                    plVar10 = (long *)std::__cxx11::string::append(local_88[0]._M_local_buf);
                    local_a8._M_allocated_capacity = *plVar10;
                    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_allocated_capacity == paVar5) {
                      local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                      local_98._8_8_ = plVar10[3];
                      local_a8._M_allocated_capacity = (size_type)&local_98;
                    }
                    else {
                      local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                    }
                    local_a8._8_8_ = plVar10[1];
                    *plVar10 = (long)paVar5;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_e8 + 0x20),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_a8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108);
                    std::runtime_error::runtime_error(prVar9,(string *)(local_e8 + 0x20));
                    __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)&local_148);
                  if (iVar2 != 0) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ParseLocation::str_abi_cxx11_
                              ((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                    plVar10 = (long *)std::__cxx11::string::append(local_88[0]._M_local_buf);
                    local_a8._M_allocated_capacity = *plVar10;
                    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_allocated_capacity == paVar5) {
                      local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                      local_98._8_8_ = plVar10[3];
                      local_a8._M_allocated_capacity = (size_type)&local_98;
                    }
                    else {
                      local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                    }
                    local_a8._8_8_ = plVar10[1];
                    *plVar10 = (long)paVar5;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_e8 + 0x20),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_a8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_148.field_1);
                    std::runtime_error::runtime_error(prVar9,(string *)(local_e8 + 0x20));
                    __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  iVar2 = std::__cxx11::string::compare(local_108);
                  if ((((iVar2 != 0) &&
                       (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)) &&
                      (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)) &&
                     ((iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0 &&
                      (iVar2 = std::__cxx11::string::compare(local_108), iVar2 != 0)))) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ParseLocation::str_abi_cxx11_
                              ((string *)local_88,(ParseLocation *)(*in_RDX + 0x10));
                    plVar10 = (long *)std::__cxx11::string::append(local_88[0]._M_local_buf);
                    local_a8._M_allocated_capacity = *plVar10;
                    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_allocated_capacity == paVar5) {
                      local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                      local_98._8_8_ = plVar10[3];
                      local_a8._M_allocated_capacity = (size_type)&local_98;
                    }
                    else {
                      local_98._M_allocated_capacity = paVar5->_M_allocated_capacity;
                    }
                    local_a8._8_8_ = plVar10[1];
                    *plVar10 = (long)paVar5;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_e8 + 0x20),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_a8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108);
                    std::runtime_error::runtime_error(prVar9,(string *)(local_e8 + 0x20));
                    __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
              }
            }
          }
          loadCurves((XMLLoader *)(local_e8 + 0x20),xml,subtype);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_c8._M_allocated_capacity;
          pmVar3->ptr = (Node *)local_c8._M_allocated_capacity;
          local_c8._M_allocated_capacity = 0;
          if ((Node *)uVar15 != (Node *)0x0) {
            (**(code **)(*(long *)uVar15 + 0x10))();
          }
          plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 0x18))();
          }
          (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
          if ((_func_int **)local_108._0_8_ != pp_Var13) {
            operator_delete((void *)local_108._0_8_);
          }
          goto LAB_001c37b6;
        }
        xml_00 = (Ref<embree::XML> *)0x22487a;
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadPerspectiveCamera((XMLLoader *)&local_148.field_1,xml_00);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        pcVar14 = "AnimatedPerspectiveCamera";
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadAnimatedPerspectiveCamera((XMLLoader *)&local_148.field_1,(Ref<embree::XML> *)pcVar14)
          ;
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadGroupNode((XMLLoader *)&local_148.field_1,xml);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadTransformNode((XMLLoader *)&local_148.field_1,xml);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadMultiTransformNode((XMLLoader *)&local_148.field_1,xml);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadTransform2Node((XMLLoader *)&local_148.field_1,xml);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadTransformAnimationNode((XMLLoader *)&local_148.field_1,xml);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadAnimation2Node((XMLLoader *)&local_148.field_1,xml);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadAnimationNode((XMLLoader *)&local_148.field_1,xml);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar15 = local_148._0_8_;
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)uVar15 + 0x10))();
          }
          goto LAB_001c2f9a;
        }
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          XML::child((XML *)local_108,*in_RDX);
          loadNode((XMLLoader *)(local_40 + 8),xml);
          SceneGraph::convert_triangles_to_quads
                    ((SceneGraph *)&local_148.field_1,
                     (Ref<embree::SceneGraph::Node> *)(local_40 + 8),INFINITY);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,(key_type *)local_e8);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pmVar3->ptr = (Node *)local_148._0_8_;
          local_148._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
          }
          plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 0x18))();
          }
          (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_148._0_8_ + 0x18))();
          }
          if ((_Base_ptr)local_40._8_8_ != (_Base_ptr)0x0) {
            (**(code **)(*(long *)local_40._8_8_ + 0x18))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_108._0_8_ + 0x18))();
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
          if (iVar2 == 0) {
            XML::child((XML *)local_108,*in_RDX);
            loadNode((XMLLoader *)local_40,xml);
            SceneGraph::convert_triangles_to_quads
                      ((SceneGraph *)&local_148.field_1,(Ref<embree::SceneGraph::Node> *)local_40,
                       0.5);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                   *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent,(key_type *)local_e8);
            if (pmVar3->ptr != (Node *)0x0) {
              (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
            }
            pmVar3->ptr = (Node *)local_148._0_8_;
            local_148._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            if (pmVar3->ptr != (Node *)0x0) {
              (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
            }
            plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
            if (plVar10 != (long *)0x0) {
              (**(code **)(*plVar10 + 0x18))();
            }
            (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_148._0_8_ + 0x18))();
            }
            if ((pointer)local_40._0_8_ != (pointer)0x0) {
              (**(code **)(*(long *)local_40._0_8_ + 0x18))();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_108._0_8_ + 0x18))();
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
            if (iVar2 == 0) {
              XML::child((XML *)local_108,*in_RDX);
              loadNode((XMLLoader *)local_48,xml);
              SceneGraph::convert_quads_to_subdivs
                        ((SceneGraph *)&local_148.field_1,(Ref<embree::SceneGraph::Node> *)local_48)
              ;
              pmVar3 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                     *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent,(key_type *)local_e8);
              if (pmVar3->ptr != (Node *)0x0) {
                (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
              }
              pmVar3->ptr = (Node *)local_148._0_8_;
              local_148._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              if (pmVar3->ptr != (Node *)0x0) {
                (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
              }
              plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
              if (plVar10 != (long *)0x0) {
                (**(code **)(*plVar10 + 0x18))();
              }
              (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_148._0_8_ + 0x18))();
              }
              if (local_48 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_48 + 0x18))();
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_108._0_8_ + 0x18))();
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
              if (iVar2 == 0) {
                XML::child((XML *)local_108,*in_RDX);
                loadNode((XMLLoader *)local_50,xml);
                SceneGraph::convert_bezier_to_lines
                          ((SceneGraph *)&local_148.field_1,
                           (Ref<embree::SceneGraph::Node> *)local_50);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                       *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent,(key_type *)local_e8);
                if (pmVar3->ptr != (Node *)0x0) {
                  (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                }
                pmVar3->ptr = (Node *)local_148._0_8_;
                local_148._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                if (pmVar3->ptr != (Node *)0x0) {
                  (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
                }
                plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
                if (plVar10 != (long *)0x0) {
                  (**(code **)(*plVar10 + 0x18))();
                }
                (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_148._0_8_ + 0x18))();
                }
                if (local_50 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_50 + 0x18))();
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_108._0_8_ + 0x18))();
                }
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
                if (iVar2 == 0) {
                  XML::child((XML *)local_108,*in_RDX);
                  loadNode((XMLLoader *)(local_60 + 8),xml);
                  SceneGraph::convert_flat_to_round_curves
                            ((SceneGraph *)&local_148.field_1,
                             (Ref<embree::SceneGraph::Node> *)(local_60 + 8));
                  pmVar3 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                         *)&((xml[10].ptr)->parms)._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_parent,
                                        (key_type *)local_e8);
                  if (pmVar3->ptr != (Node *)0x0) {
                    (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                  }
                  pmVar3->ptr = (Node *)local_148._0_8_;
                  local_148._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  if (pmVar3->ptr != (Node *)0x0) {
                    (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
                  }
                  plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
                  if (plVar10 != (long *)0x0) {
                    (**(code **)(*plVar10 + 0x18))();
                  }
                  (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_148._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_148._0_8_ + 0x18))();
                  }
                  if ((_Base_ptr)local_60._8_8_ != (_Base_ptr)0x0) {
                    (*(code *)((*(XML **)local_60._8_8_)->loc).fileName.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)();
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_108._0_8_ + 0x18))();
                  }
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
                  if (iVar2 == 0) {
                    XML::child((XML *)local_108,*in_RDX);
                    loadNode((XMLLoader *)local_60,xml);
                    SceneGraph::flatten((SceneGraph *)&local_148.field_1,
                                        (Ref<embree::SceneGraph::Node> *)local_60,INSTANCING_NONE);
                    pmVar3 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                           *)&((xml[10].ptr)->parms)._M_t._M_impl.
                                              super__Rb_tree_header._M_header._M_parent,
                                          (key_type *)local_e8);
                    if (pmVar3->ptr != (Node *)0x0) {
                      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                    }
                    pmVar3->ptr = (Node *)local_148._0_8_;
                    local_148._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    if (pmVar3->ptr != (Node *)0x0) {
                      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[2])();
                    }
                    plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
                    if (plVar10 != (long *)0x0) {
                      (**(code **)(*plVar10 + 0x18))();
                    }
                    (this->path).filename._M_dataplus._M_p = (pointer)pmVar3->ptr;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      (**(code **)(*(size_type *)local_148._0_8_ + 0x18))();
                    }
                    if ((pointer)local_60._0_8_ != (pointer)0x0) {
                      (**(code **)(*(long *)local_60._0_8_ + 0x18))();
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      (**(code **)(*(size_type *)local_108._0_8_ + 0x18))();
                    }
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
                      if (iVar2 != 0) {
                        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                        ParseLocation::str_abi_cxx11_
                                  ((string *)(local_e8 + 0x20),(ParseLocation *)(*in_RDX + 0x10));
                        plVar10 = (long *)std::__cxx11::string::append(local_e8 + 0x20);
                        local_108._0_8_ = *plVar10;
                        pp_Var13 = (_func_int **)(plVar10 + 2);
                        if ((_func_int **)local_108._0_8_ == pp_Var13) {
                          local_f8._M_allocated_capacity = (size_type)*pp_Var13;
                          local_f8._8_8_ = plVar10[3];
                          local_108._0_8_ = local_108 + 0x10;
                        }
                        else {
                          local_f8._M_allocated_capacity = (size_type)*pp_Var13;
                        }
                        local_108._8_8_ = plVar10[1];
                        *plVar10 = (long)pp_Var13;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_148.field_1,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_108,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(*in_RDX + 0x30));
                        std::runtime_error::runtime_error(prVar9,(string *)&local_148.field_1);
                        __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      loadFurBall((XMLLoader *)&local_148.field_1,xml);
                      pmVar3 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                             *)&((xml[10].ptr)->parms)._M_t._M_impl.
                                                super__Rb_tree_header._M_header._M_parent,
                                            (key_type *)local_e8);
                      if (pmVar3->ptr != (Node *)0x0) {
                        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                      }
                      uVar15 = local_148._0_8_;
                      pmVar3->ptr = (Node *)local_148._0_8_;
                      local_148._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)uVar15 !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        (**(code **)(*(size_type *)uVar15 + 0x10))();
                      }
                      plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
                      if (plVar10 != (long *)0x0) {
                        (**(code **)(*plVar10 + 0x18))();
                      }
                      goto LAB_001c2f9a;
                    }
                    parmID = (string *)*in_RDX;
                    local_148._0_8_ = &local_138;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"time","");
                    XML::parm_Vec2f((XML *)local_108,parmID);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._0_8_ != &local_138) {
                      operator_delete((void *)local_148._0_8_);
                    }
                    XML::child((XML *)(local_e8 + 0x20),*in_RDX);
                    loadNode((XMLLoader *)&local_148.field_1,xml);
                    pmVar3 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                           *)&((xml[10].ptr)->parms)._M_t._M_impl.
                                              super__Rb_tree_header._M_header._M_parent,
                                          (key_type *)local_e8);
                    if (pmVar3->ptr != (Node *)0x0) {
                      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                    }
                    uVar15 = local_148._0_8_;
                    pmVar3->ptr = (Node *)local_148._0_8_;
                    local_148._0_8_ = 0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)uVar15 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      (**(code **)(*(size_type *)uVar15 + 0x10))();
                    }
                    plVar10 = (long *)(this->path).filename._M_dataplus._M_p;
                    if (plVar10 != (long *)0x0) {
                      (**(code **)(*plVar10 + 0x18))();
                    }
                    pNVar7 = pmVar3->ptr;
                    (this->path).filename._M_dataplus._M_p = (pointer)pNVar7;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_allocated_capacity !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      (**(code **)(*local_c8._M_allocated_capacity + 0x18))();
                    }
                    local_68._M_p = (pointer)pNVar7;
                    if (pNVar7 != (Node *)0x0) {
                      (*(pNVar7->super_RefCount)._vptr_RefCount[2])(pNVar7);
                    }
                    local_148._0_8_ = local_108._0_8_;
                    SceneGraph::set_time_range
                              ((Ref<embree::SceneGraph::Node> *)&local_68,
                               (BBox1f *)&local_148.field_1);
                    if ((Node *)local_68._M_p != (Node *)0x0) {
                      (**(code **)(*(long *)local_68._M_p + 0x18))();
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001c25f1:
  pXVar1 = (XML *)*in_RDX;
  local_108._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_108 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"name","");
  XML::parm((string *)&local_148.field_1,pXVar1,(string *)local_108);
  std::__cxx11::string::operator=
            ((string *)((this->path).filename._M_dataplus._M_p + 0x30),(string *)&local_148.field_1)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._0_8_ != &local_138) {
    operator_delete((void *)local_148._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_);
  }
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_e8 + 0x10);
  uVar15 = local_e8._0_8_;
LAB_001c2669:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar15 != paVar5) {
    operator_delete((void *)uVar15);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadNode(const Ref<XML>& xml)
  {
    if (xml->name == "assign") 
    {
      if (xml->parm("type") == "material") 
      {
        const std::string id = xml->parm("id");
        Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child(0));
        state.materialMap[id] = material;
        material->name = xml->parm("name");
        return nullptr;
      }
      else if (xml->parm("type") == "scene")
      {
        const std::string id = xml->parm("id");
        state.sceneMap[id] = loadNode(xml->child(0));
        return nullptr;
      }
      else 
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown type: "+xml->parm("type"));
    }
    else 
    {
      Ref<SceneGraph::Node> node = nullptr;
      const std::string id = xml->parm("id");
      if (xml->name == "extern") 
        node = state.sceneMap[id] = SceneGraph::load(path + xml->parm("src"));
      else if (xml->name == "xml")
        node = state.sceneMap[id] = XMLLoader::load(path + xml->parm("src"),one,state);
      else if (xml->name == "extern_combine") 
        node = state.sceneMap[id] = SceneGraph::load(path + xml->parm("src"),true);
      else if (xml->name == "obj"             ) {
        const bool subdiv_mode = xml->parm("subdiv") == "1";
        node = state.sceneMap[id] = loadOBJ(path + xml->parm("src"),subdiv_mode);
      }

      else if (xml->name == "ref"             ) node = state.sceneMap[id] = state.sceneMap[xml->parm("id")];
      else if (xml->name == "PointLight"      ) node = state.sceneMap[id] = loadPointLight      (xml);
      else if (xml->name == "SpotLight"       ) node = state.sceneMap[id] = loadSpotLight       (xml);
      else if (xml->name == "DirectionalLight") node = state.sceneMap[id] = loadDirectionalLight(xml);
      else if (xml->name == "DistantLight"    ) node = state.sceneMap[id] = loadDistantLight    (xml);
      else if (xml->name == "AmbientLight"    ) node = state.sceneMap[id] = loadAmbientLight    (xml);
      else if (xml->name == "TriangleLight"   ) node = state.sceneMap[id] = loadTriangleLight   (xml);
      else if (xml->name == "AnimatedLight"   ) node = state.sceneMap[id] = loadAnimatedLight   (xml);
      else if (xml->name == "QuadLight"       ) node = state.sceneMap[id] = loadQuadLight       (xml);
      else if (xml->name == "TriangleMesh"    ) node = state.sceneMap[id] = loadTriangleMesh    (xml);
      else if (xml->name == "QuadMesh"        ) node = state.sceneMap[id] = loadQuadMesh        (xml);
      else if (xml->name == "GridMesh"        ) node = state.sceneMap[id] = loadGridMesh        (xml);
      else if (xml->name == "SubdivisionMesh" ) node = state.sceneMap[id] = loadSubdivMesh      (xml);

      /* just for compatibility, use Curves XML node instead */
      else if (xml->name == "Hair"             ) node = state.sceneMap[id] = loadBezierCurves    (xml,SceneGraph::FLAT_CURVE);
      else if (xml->name == "LineSegments"     ) node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE);
      else if (xml->name == "RoundLineSegments") node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE);
      else if (xml->name == "ConeSegments")      node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_CONE_LINEAR_CURVE);
      else if (xml->name == "BezierHair"       ) node = state.sceneMap[id] = loadBezierCurves    (xml,SceneGraph::FLAT_CURVE);
      else if (xml->name == "BSplineHair"      ) node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE);
      else if (xml->name == "BezierCurves"     ) node = state.sceneMap[id] = loadBezierCurves    (xml,SceneGraph::ROUND_CURVE);
      else if (xml->name == "BSplineCurves"    ) node = state.sceneMap[id] = loadCurves          (xml,RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE);

      else if (xml->name == "Points")
      {
        RTCGeometryType type;
        std::string str_type = xml->parm("type");
        if      (str_type == "sphere")   { type = RTC_GEOMETRY_TYPE_SPHERE_POINT; }
        else if (str_type == "disc")     { type = RTC_GEOMETRY_TYPE_DISC_POINT; }
        else if (str_type == "oriented") { type = RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT; }
        else { THROW_RUNTIME_ERROR(xml->loc.str()+": unknown point type: "+str_type); }
        node = state.sceneMap[id] = loadPoints(xml,type);
      }

      else if (xml->name == "Curves")
      {
        RTCGeometryType type;
        std::string str_type = xml->parm("basis");
        std::string str_subtype = xml->parm("type");
        if (str_type == "linear")
        {
          if (str_subtype == "flat")
            type = RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE;
          else if (str_subtype == "round")
            type = RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE;
          //else if (str_subtype == "normal_oriented")
          //  type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_LINEAR_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else if (str_type == "bezier")
        {
          if (str_subtype == "flat" || str_subtype == "ribbon")
            type = RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
          else if (str_subtype == "round" || str_subtype == "surface")
            type = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
          else if (str_subtype == "normal_oriented")
            type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else if (str_type == "bspline")
        {
          if (str_subtype == "flat" || str_subtype == "ribbon")
            type = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
          else if (str_subtype == "round" ||str_subtype == "surface")
            type = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;
          else if (str_subtype == "normal_oriented")
            type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else if (str_type == "hermite")
        {
          if (str_subtype == "flat" || str_subtype == "ribbon")
            type = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
          else if (str_subtype == "round" ||str_subtype == "surface")
            type = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;
          else if (str_subtype == "normal_oriented")
            type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else if (str_type == "catmull_rom")
        {
          if (str_subtype == "flat" || str_subtype == "ribbon")
            type = RTC_GEOMETRY_TYPE_FLAT_CATMULL_ROM_CURVE;
          else if (str_subtype == "round" || str_subtype == "surface")
            type = RTC_GEOMETRY_TYPE_ROUND_CATMULL_ROM_CURVE;
          else if (str_subtype == "normal_oriented")
            type = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_CATMULL_ROM_CURVE;
          else
            THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve type: "+str_subtype);
        }
        else
          THROW_RUNTIME_ERROR(xml->loc.str()+": unknown curve basis: "+str_type);
        
        node = state.sceneMap[id] = loadCurves(xml,type);
      }
      else if (xml->name == "PerspectiveCamera") node = state.sceneMap[id] = loadPerspectiveCamera(xml);
      else if (xml->name == "AnimatedPerspectiveCamera") node = state.sceneMap[id] = loadAnimatedPerspectiveCamera(xml);
      else if (xml->name == "Group"           ) node = state.sceneMap[id] = loadGroupNode       (xml);
      else if (xml->name == "Transform"       ) node = state.sceneMap[id] = loadTransformNode   (xml);
      else if (xml->name == "MultiTransform"  ) node = state.sceneMap[id] = loadMultiTransformNode(xml);
      else if (xml->name == "Transform2"      ) node = state.sceneMap[id] = loadTransform2Node  (xml);
      else if (xml->name == "TransformAnimation") node = state.sceneMap[id] = loadTransformAnimationNode(xml);
      else if (xml->name == "Animation2"      ) node = state.sceneMap[id] = loadAnimation2Node  (xml);
      else if (xml->name == "Animation"       ) node = state.sceneMap[id] = loadAnimationNode   (xml);

      else if (xml->name == "ConvertTrianglesToQuads") node = state.sceneMap[id] = convert_triangles_to_quads(loadNode(xml->child(0)),inf);
      else if (xml->name == "ConvertTrianglesToTrianglesAndQuads") node = state.sceneMap[id] = convert_triangles_to_quads(loadNode(xml->child(0)),0.5f);
      else if (xml->name == "ConvertQuadsToSubdivs"  ) node = state.sceneMap[id] = convert_quads_to_subdivs  (loadNode(xml->child(0)));
      else if (xml->name == "ConvertBezierToLines"   ) node = state.sceneMap[id] = convert_bezier_to_lines   (loadNode(xml->child(0)));
      else if (xml->name == "ConvertHairToCurves"    ) node = state.sceneMap[id] = convert_flat_to_round_curves(loadNode(xml->child(0)));
      else if (xml->name == "Flatten"                ) node = state.sceneMap[id] = flatten(loadNode(xml->child(0)), SceneGraph::INSTANCING_NONE);
      else if (xml->name == "TimeRange"              ) {
        const Vec2f time_range = xml->parm_Vec2f("time");
        node = state.sceneMap[id] = loadNode(xml->child(0));
        set_time_range(node,BBox1f(time_range.x,time_range.y));
      }

      else if (xml->name == "FurBall") node = state.sceneMap[id] = loadFurBall(xml);

      else THROW_RUNTIME_ERROR(xml->loc.str()+": unknown tag: "+xml->name);

      node->name = xml->parm("name");
      return node;
    }

    return nullptr;
  }